

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arc.c
# Opt level: O1

atom copy_list(atom list)

{
  uint *puVar1;
  anon_union_8_9_1d3277aa_for_value aVar2;
  undefined8 uVar3;
  anon_union_8_9_1d3277aa_for_value aVar4;
  bool bVar5;
  atom car_val;
  atom aVar6;
  atom aVar7;
  uint *local_28;
  
  aVar4 = list.value;
  if (list.type == T_NIL) {
    aVar2.number = 0.0;
    uVar3 = 0;
  }
  else {
    aVar6._4_4_ = 0;
    aVar6.type = ((aVar4.pair)->car).type;
    aVar6.value.symbol = (aVar4.fp)->_IO_read_ptr;
    aVar6 = cons(aVar6,(atom)ZEXT816(0));
    aVar2 = aVar6.value;
    bVar5 = ((aVar4.pair)->cdr).type != T_NIL;
    local_28 = (uint *)(aVar4.fp)->_IO_read_base;
    uVar3 = 1;
    aVar4 = aVar2;
    do {
      if (!bVar5) break;
      car_val._4_4_ = 0;
      car_val.type = *local_28;
      car_val.value.pair = ((anon_union_8_9_1d3277aa_for_value *)(local_28 + 2))->pair;
      aVar6 = cons(car_val,(atom)ZEXT816(0));
      ((aVar4.pair)->cdr).type = T_CONS;
      ((anon_union_8_9_1d3277aa_for_value *)((*aVar4.jb)[0].__jmpbuf + 3))->pair =
           (pair *)aVar6.value;
      puVar1 = local_28 + 4;
      local_28 = *(uint **)(local_28 + 6);
      bVar5 = true;
      aVar4 = aVar6.value;
    } while (*puVar1 == 1);
  }
  aVar7.value.pair = aVar2.pair;
  aVar7._0_8_ = uVar3;
  return aVar7;
}

Assistant:

atom copy_list(atom list)
{
	atom a, p;

	if (no(list))
		return nil;

	a = cons(car(list), nil);
	p = a;
	list = cdr(list);

	while (!no(list)) {
		cdr(p) = cons(car(list), nil);
		p = cdr(p);
		list = cdr(list);
		if (list.type != T_CONS) { /* improper list */
			p = list;
			break;
		}
	}

	return a;
}